

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall ON_Material::ON_Material(ON_Material *this,ON_Material *src)

{
  ON_Color OVar1;
  
  ON_ModelComponent::ON_ModelComponent
            (&this->super_ON_ModelComponent,Material,&src->super_ON_ModelComponent);
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00824dd0;
  (this->m_rdk_material_instance_id).Data1 = 0;
  (this->m_rdk_material_instance_id).Data2 = 0;
  (this->m_rdk_material_instance_id).Data3 = 0;
  (this->m_rdk_material_instance_id).Data4[0] = '\0';
  OVar1 = ON_Color::Black;
  (this->m_rdk_material_instance_id).Data4[1] = '\0';
  (this->m_rdk_material_instance_id).Data4[2] = '\0';
  (this->m_rdk_material_instance_id).Data4[3] = '\0';
  (this->m_rdk_material_instance_id).Data4[4] = '\0';
  (this->m_rdk_material_instance_id).Data4[5] = '\0';
  (this->m_rdk_material_instance_id).Data4[6] = '\0';
  (this->m_rdk_material_instance_id).Data4[7] = '\0';
  (this->m_ambient).field_0 = ON_Color::Black.field_0;
  (this->m_diffuse).field_0 = ON_Color::Gray126.field_0;
  (this->m_emission).field_0 = OVar1.field_0;
  OVar1 = ON_Color::White;
  (this->m_specular).field_0 = ON_Color::White.field_0;
  (this->m_reflection).field_0 = OVar1.field_0;
  (this->m_transparent).field_0 = OVar1.field_0;
  this->m_bShareable = false;
  this->m_bDisableLighting = false;
  this->m_bUseDiffuseTextureAlphaForObjectTransparencyTexture = false;
  this->m_bFresnelReflections = false;
  this->m_reserved1 = 0;
  this->m_reflectivity = 0.0;
  this->m_shine = 0.0;
  this->m_transparency = 0.0;
  this->m_reflection_glossiness = 0.0;
  this->m_refraction_glossiness = 0.0;
  this->m_index_of_refraction = 1.0;
  this->m_fresnel_index_of_refraction = 1.56;
  (this->m_textures).super_ON_ClassArray<ON_Texture>.m_a = (ON_Texture *)0x0;
  (this->m_textures).super_ON_ClassArray<ON_Texture>.m_count = 0;
  (this->m_textures).super_ON_ClassArray<ON_Texture>.m_capacity = 0;
  (this->m_textures).super_ON_ClassArray<ON_Texture>._vptr_ON_ClassArray =
       (_func_int **)&PTR__ON_ClassArray_00825938;
  (this->m_material_channel)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081d088;
  (this->m_material_channel).m_a = (ON_UuidIndex *)0x0;
  (this->m_material_channel).m_count = 0;
  (this->m_material_channel).m_capacity = 0;
  (this->m_plugin_id).Data1 = 0;
  (this->m_plugin_id).Data2 = 0;
  (this->m_plugin_id).Data3 = 0;
  (this->m_plugin_id).Data4[0] = '\0';
  (this->m_plugin_id).Data4[1] = '\0';
  (this->m_plugin_id).Data4[2] = '\0';
  (this->m_plugin_id).Data4[3] = '\0';
  (this->m_plugin_id).Data4[4] = '\0';
  (this->m_plugin_id).Data4[5] = '\0';
  (this->m_plugin_id).Data4[6] = '\0';
  (this->m_plugin_id).Data4[7] = '\0';
  Internal_CopyFrom(this,src);
  return;
}

Assistant:

ON_Material::ON_Material( const ON_Material& src)
  : ON_ModelComponent(ON_ModelComponent::Type::RenderMaterial,src)
{
  Internal_CopyFrom(src);
}